

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O2

void __thiscall CompressedArray::dump(CompressedArray *this,ostream *out)

{
  const_reference cVar1;
  uint uVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  byte bVar5;
  uint8_t buffer;
  uint32_t blocks_count;
  uint32_t size;
  
  std::ostream::write((char *)out,(long)&this->word_index_diff_log_radix);
  std::ostream::write((char *)out,(long)&this->context_index_diff_log_radix);
  std::ostream::write((char *)out,(long)&this->context_index_log_radix);
  std::ostream::write((char *)out,(long)&this->ngram_count_index_log_radix);
  std::ostream::write((char *)out,(long)&this->continuations_count_index_log_radix);
  std::ostream::write((char *)out,(long)&this->unique_continuations_count_index_log_radix);
  std::ostream::write((char *)out,(long)&this->record_count);
  Vocabulary<unsigned_int>::dump(&this->ngram_count_values,out);
  Vocabulary<unsigned_int>::dump(&this->continuations_count_values,out);
  Vocabulary<unsigned_int>::dump(&this->unique_continuations_count_values,out);
  blocks_count = (uint32_t)
                 ((ulong)((long)(this->headers).
                                super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->headers).
                               super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::ostream::write((char *)out,(long)&blocks_count);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < blocks_count; uVar4 = uVar4 + 1) {
    std::ostream::write((char *)out,
                        (long)&(((this->headers).
                                 super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->key).word_index + lVar3
                       );
    std::ostream::write((char *)out,
                        (long)&(((this->headers).
                                 super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->key).context_index +
                        lVar3);
    std::ostream::write((char *)out,
                        (long)&((this->headers).
                                super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                ._M_impl.super__Vector_impl_data._M_start)->offset + lVar3);
    std::ostream::write((char *)out,
                        (long)&((this->headers).
                                super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                                ._M_impl.super__Vector_impl_data._M_start)->record_index + lVar3);
    lVar3 = lVar3 + 0x10;
  }
  buffer = '\0';
  size = (*(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         *(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
         (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
  std::ostream::write((char *)out,(long)&size);
  bVar5 = 0;
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p) * 8; uVar2 = uVar2 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->data,(ulong)uVar2);
    buffer = buffer | cVar1 << (bVar5 & 0x1f);
    bVar5 = bVar5 + 1;
    if (bVar5 == 8) {
      std::ostream::write((char *)out,(long)&buffer);
      buffer = '\0';
      bVar5 = 0;
    }
  }
  if (bVar5 != 0) {
    std::ostream::write((char *)out,(long)&buffer);
  }
  return;
}

Assistant:

void CompressedArray::dump(ostream& out) const {
    out.write((char*)(&word_index_diff_log_radix), sizeof(word_index_diff_log_radix));
    out.write((char*)(&context_index_diff_log_radix), sizeof(context_index_diff_log_radix));
    out.write((char*)(&context_index_log_radix), sizeof(context_index_log_radix));
    out.write((char*)(&ngram_count_index_log_radix), sizeof(ngram_count_index_log_radix));
    out.write((char*)(&continuations_count_index_log_radix),
              sizeof(continuations_count_index_log_radix));
    out.write((char*)(&unique_continuations_count_index_log_radix),
              sizeof(unique_continuations_count_index_log_radix));

    out.write((char*)(&record_count), sizeof(record_count));

    ngram_count_values.dump(out);
    continuations_count_values.dump(out);
    unique_continuations_count_values.dump(out);

    uint32_t blocks_count = uint32_t(headers.size());
    out.write((char*)(&blocks_count), sizeof(blocks_count));
    for (uint32_t i = 0; i < blocks_count; i++) {
        out.write((char*)(&headers[i].key.word_index), sizeof(headers[i].key.word_index));
        out.write((char*)(&headers[i].key.context_index), sizeof(headers[i].key.context_index));
        out.write((char*)(&headers[i].offset), sizeof(headers[i].offset));
        out.write((char*)(&headers[i].record_index), sizeof(headers[i].record_index));
    }

    uint8_t buffer = 0;
    uint8_t idx = 0;
    uint32_t size = uint32_t(data.size());
    out.write((char*)(&size), sizeof(size));
    for (uint32_t i = 0; i < data.size(); i++) {
        buffer |= data[i] << idx;
        idx++;
        if (idx == 8) {
            out.write((char*)(&buffer), sizeof(buffer));
            idx = 0;
            buffer = 0;
        }
    }
    if (idx > 0)
        out.write((char*)(&buffer), sizeof(buffer));
}